

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::RBCOMVisitor::~RBCOMVisitor(RBCOMVisitor *this)

{
  BaseVisitor::~BaseVisitor((BaseVisitor *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

RBCOMVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "RBCOMVisitor";
    }